

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

void ugolemeffects(int damtype,int dam)

{
  int local_14;
  int heal;
  int dam_local;
  int damtype_local;
  
  local_14 = 0;
  if ((u.umonnum == 0x106) || (u.umonnum == 0x10a)) {
    if (damtype == 2) {
      if (u.umonnum == 0x10a) {
        local_14 = dam;
      }
    }
    else if ((damtype == 6) && (u.umonnum == 0x106)) {
      local_14 = dam / 6;
    }
    if ((local_14 != 0) && (u.mh < u.mhmax)) {
      u.mh = local_14 + u.mh;
      if (u.mhmax < u.mh) {
        u.mh = u.mhmax;
      }
      iflags.botl = '\x01';
      pline("Strangely, you feel better than before.");
      exercise(0,'\x01');
    }
  }
  return;
}

Assistant:

void ugolemeffects(int damtype, int dam)
{
	int heal = 0;
	/* We won't bother with "slow"/"haste" since players do not
	 * have a monster-specific slow/haste so there is no way to
	 * restore the old velocity once they are back to human.
	 */
	if (u.umonnum != PM_FLESH_GOLEM && u.umonnum != PM_IRON_GOLEM)
		return;
	switch (damtype) {
		case AD_ELEC: if (u.umonnum == PM_FLESH_GOLEM)
				heal = dam / 6; /* Approx 1 per die */
			break;
		case AD_FIRE: if (u.umonnum == PM_IRON_GOLEM)
				heal = dam;
			break;
	}
	if (heal && (u.mh < u.mhmax)) {
		u.mh += heal;
		if (u.mh > u.mhmax) u.mh = u.mhmax;
		iflags.botl = 1;
		pline("Strangely, you feel better than before.");
		exercise(A_STR, TRUE);
	}
}